

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::SkelAnimation>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,SkelAnimation *anim,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  double t;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  const_iterator cVar6;
  Property *pPVar7;
  Property *extraout_RAX;
  undefined7 extraout_var;
  uint7 extraout_var_00;
  undefined7 extraout_var_01;
  Property *extraout_RAX_00;
  uint7 extraout_var_02;
  uint7 extraout_var_03;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *pvVar8;
  Property *extraout_RAX_01;
  Property *extraout_RAX_02;
  string *err_00;
  string *err_01;
  string *err_02;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *__x;
  long lVar10;
  string err;
  TimeSamples ts;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  aval;
  string local_950;
  storage_union local_930;
  vtable_type *local_920;
  undefined1 local_918;
  undefined1 local_910 [24];
  bool local_8f8;
  storage_union local_8f0;
  undefined **local_8e0;
  TimeSamples local_8d8;
  undefined1 local_8b8 [32];
  Variability local_898;
  bool local_894;
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  undefined1 local_608 [32];
  TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  local_5e8 [45];
  
  if (out_prop == (Property *)0x0) {
    local_610 = (undefined1  [8])0x418e39;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)local_610);
    return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)extraout_RAX;
  }
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  local_950._M_string_length = 0;
  local_950.field_2._M_local_buf[0] = '\0';
  iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar5 == 0) {
    bVar3 = (anonymous_namespace)::
            ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (&anim->blendShapes,out_prop,&local_950);
    pPVar7 = (Property *)CONCAT71(extraout_var,bVar3);
    if (!bVar3) {
      local_930.dynamic = &local_920;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_930,"Convert Property {} failed: {}\n","");
      fmt::format<char[12],std::__cxx11::string>
                ((string *)local_8b8,(fmt *)&local_930,(string *)0x40b6c6,(char (*) [12])&local_950,
                 in_R8);
LAB_0033b184:
      uVar2 = local_8b8._8_8_;
      cVar6._M_node = (_Base_ptr)(local_608 + 8);
      pPVar7 = (Property *)(local_8b8 + 0x10);
      if ((Property *)local_8b8._0_8_ == pPVar7) {
        local_608._16_8_ = local_8b8._24_8_;
        local_8b8._0_8_ = cVar6._M_node;
      }
      local_608._9_7_ = local_8b8._17_7_;
      local_608[8] = local_8b8[0x10];
      local_8b8._8_8_ = 0;
      local_8b8[0x10] = '\0';
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = false;
      psVar1 = (size_type *)
               ((long)&(__return_storage_ptr__->contained).
                       super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .field_0 + 0x10);
      *(size_type **)
       &(__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0 = psVar1;
      if ((_Base_ptr)local_8b8._0_8_ == cVar6._M_node) {
        *psVar1 = local_608._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x18) = local_608._16_8_;
      }
      else {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_dataplus._M_p = (pointer)local_8b8._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->contained).
                 super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0 + 0x10) = local_608._8_8_;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_string_length = uVar2;
      local_608._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_608._8_8_ = (ulong)(uint7)local_8b8._17_7_ << 8;
      local_8b8._0_8_ = pPVar7;
      local_610 = (undefined1  [8])cVar6._M_node;
      if ((vtable_type **)local_930.dynamic != &local_920) {
        operator_delete(local_930.dynamic,(ulong)((long)&local_920->type_id + 1));
        cVar6._M_node = (_Base_ptr)extraout_RAX_00;
      }
      goto LAB_0033b81c;
    }
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar5 == 0) {
      (anonymous_namespace)::ToProperty<std::vector<float,std::allocator<float>>>
                (&anim->blendShapeWeights,out_prop,err_00);
      pPVar7 = (Property *)((ulong)extraout_var_00 << 8);
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar5 == 0) {
        bVar3 = (anonymous_namespace)::
                ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                          (&anim->joints,out_prop,&local_950);
        pPVar7 = (Property *)CONCAT71(extraout_var_01,bVar3);
        if (!bVar3) {
          local_930.dynamic = &local_920;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_930,"Convert Property {} failed: {}\n","");
          fmt::format<char[7],std::__cxx11::string>
                    ((string *)local_8b8,(fmt *)&local_930,(string *)"joints",
                     (char (*) [7])&local_950,in_R8);
          goto LAB_0033b184;
        }
      }
      else {
        iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
        if (iVar5 == 0) {
          local_8b8._0_8_ = local_8b8 + 0x10;
          local_8b8._8_8_ = 0;
          local_8b8[0x10] = '\0';
          local_894 = false;
          local_890._M_p = (pointer)&local_880;
          local_888 = 0;
          local_880._M_local_buf[0] = '\0';
          local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_870._M_allocated_capacity = 0;
          local_858 = false;
          local_850._0_8_ = (pointer)0x0;
          local_850[8] = 0;
          local_850._9_7_ = 0;
          local_850[0x10] = 0;
          local_850._17_8_ = 0;
          AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          AStack_818.elementSize.has_value_ = false;
          AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
          AStack_818.hidden.has_value_ = false;
          AStack_818.hidden.contained = (storage_t<bool>)0x0;
          AStack_818.comment.has_value_ = false;
          AStack_818.weight.contained = (storage_t<double>)0x0;
          AStack_818.connectability.has_value_ = false;
          AStack_818.bindMaterialAs.contained.data._16_8_ =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.bindMaterialAs.contained._24_8_ = 0;
          AStack_818.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.bindMaterialAs.contained._8_8_ = 0;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)((long)&AStack_818.meta._M_t + 8);
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.comment.contained._8_8_ = 0;
          AStack_818.comment.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.comment.contained._24_8_ = 0;
          AStack_818.comment.contained._32_8_ = 0;
          AStack_818.comment.contained._40_8_ = 0;
          AStack_818.customData.has_value_ = false;
          AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.customData.contained._8_8_ = 0;
          AStack_818.customData.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.customData.contained._24_8_ = 0;
          AStack_818.customData.contained._32_8_ = 0;
          AStack_818.customData.contained._40_8_ = 0;
          AStack_818.weight.has_value_ = false;
          AStack_818.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.connectability.contained._8_8_ = 0;
          AStack_818.connectability.contained.data._16_8_ =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.connectability.contained._24_8_ = 0;
          AStack_818.outputName.has_value_ = false;
          AStack_818.outputName.contained._0_8_ = 0;
          AStack_818.outputName.contained._8_8_ = 0;
          AStack_818.outputName.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.outputName.contained._24_8_ = 0;
          AStack_818.renderType.has_value_ = false;
          AStack_818.sdrMetadata.has_value_ = false;
          AStack_818.renderType.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.renderType.contained._24_8_ = 0;
          AStack_818.renderType.contained._0_8_ = 0;
          AStack_818.renderType.contained._8_8_ = 0;
          AStack_818.displayName.has_value_ = false;
          AStack_818.sdrMetadata.contained._32_8_ = 0;
          AStack_818.sdrMetadata.contained._40_8_ = 0;
          AStack_818.sdrMetadata.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.sdrMetadata.contained._24_8_ = 0;
          AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.sdrMetadata.contained._8_8_ = 0;
          AStack_818.displayGroup.has_value_ = false;
          AStack_818.displayName.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.displayName.contained._24_8_ = 0;
          AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.displayName.contained._8_8_ = 0;
          AStack_818.bindMaterialAs.has_value_ = false;
          AStack_818.displayGroup.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_818.displayGroup.contained._24_8_ = 0;
          AStack_818.displayGroup.contained._0_8_ = 0;
          AStack_818.displayGroup.contained._8_8_ = 0;
          local_830[0x10] = 0;
          stack0xfffffffffffff7e1 = 0;
          local_830._0_8_ = (pointer)0x0;
          local_830[8] = 0;
          local_830._9_7_ = 0;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          AStack_818.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_898 = Varying;
          AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          tinyusdz::value::
          TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
          type_name_abi_cxx11_();
          ::std::__cxx11::string::_M_assign((string *)&local_890);
          if (local_610 != (undefined1  [8])(local_608 + 8)) {
            operator_delete((void *)local_610,local_608._8_8_ + 1);
          }
          if ((anim->rotations)._blocked == true) {
            local_858 = true;
          }
          if ((anim->rotations)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (anim->rotations)._paths.
              super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
                       &(anim->rotations)._paths);
          }
          local_920 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_930.dynamic = (vtable_type **)0x0;
          local_918 = 0;
          local_910._0_8_ = (pointer)0x0;
          local_910[8] = 0;
          local_910._9_7_ = 0;
          local_910[0x10] = 0;
          stack0xfffffffffffff701 = 0;
          nonstd::optional_lite::
          optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
          ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                      *)local_610,&(anim->rotations)._attrib);
          if (local_610[0] == true) {
            bVar4 = 1;
            if (local_608[0x19] == '\x01') {
              local_858 = true;
              if (local_608[0x18] != '\0') {
LAB_0033b548:
                bVar4 = local_610[0];
              }
            }
            else if (local_608[0x18] != '\0') {
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        &local_8d8,
                        (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        local_608);
              local_8e0 = &linb::any::
                           vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                           ::table;
              pvVar8 = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       operator_new(0x18);
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                        (pvVar8,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 *)&local_8d8);
              local_8f0.dynamic = pvVar8;
              linb::any::operator=((any *)&local_930,(any *)&local_8f0);
              if (local_8e0 != (undefined **)0x0) {
                (*(code *)local_8e0[4])(&local_8f0);
              }
              if (local_8d8._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_8d8._samples.
                                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                CONCAT71(local_8d8._samples.
                                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                         local_8d8._samples.
                                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                                (long)local_8d8._samples.
                                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_0033b548;
            }
            if ((bVar4 & 1) == 0) {
LAB_0033b851:
              __assert_fail("has_value()",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                            ,0x591,
                            "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf>>>::value() [T = tinyusdz::Animatable<std::vector<tinyusdz::value::quatf>>]"
                           );
            }
            if (local_5e8[0]._dirty == true) {
              TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::update(local_5e8);
              bVar4 = local_610[0];
            }
            if (local_5e8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_5e8[0]._samples.
                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if ((bVar4 & 1) == 0) goto LAB_0033b851;
              if (local_5e8[0]._dirty == true) {
                TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::update(local_5e8);
              }
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
              local_8d8._dirty = false;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
              local_8d8._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
              if (local_5e8[0]._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_5e8[0]._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar10 = 8;
                uVar9 = 0;
                do {
                  t = *(double *)
                       ((long)local_5e8[0]._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start + -8 + lVar10);
                  __x = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                        ((long)local_5e8[0]._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar10);
                  local_8e0 = &linb::any::
                               vtable_for_type<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>()
                               ::table;
                  pvVar8 = (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)operator_new(0x18);
                  ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                  vector(pvVar8,__x);
                  local_8f0.dynamic = pvVar8;
                  tinyusdz::value::TimeSamples::add_sample(&local_8d8,t,(Value *)&local_8f0);
                  if (local_8e0 != (undefined **)0x0) {
                    (*(code *)local_8e0[4])(&local_8f0);
                  }
                  uVar9 = uVar9 + 1;
                  lVar10 = lVar10 + 0x28;
                } while (uVar9 < (ulong)(((long)local_5e8[0]._samples.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_5e8[0]._samples.
                                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                        -0x3333333333333333));
              }
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)local_910,&local_8d8._samples);
              stack0xfffffffffffff701 = CONCAT17(local_8d8._dirty,local_910._17_7_);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::~vector(&local_8d8._samples);
              bVar4 = local_610[0];
            }
            if ((bVar4 & 1) == 0) goto LAB_0033b851;
            if (local_608[0x18] == '\0') {
              if (local_5e8[0]._dirty == true) {
                TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::update(local_5e8);
              }
              if (local_5e8[0]._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_5e8[0]._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start) goto LAB_0033b704;
            }
            Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_930);
          }
LAB_0033b704:
          if (local_610[0] == true) {
            nonstd::optional_lite::detail::
            storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
            ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                              *)local_608);
          }
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_910);
          if (local_920 != (vtable_type *)0x0) {
            (*local_920->destroy)(&local_930);
          }
          AttrMetas::operator=(&AStack_818,&(anim->rotations)._metas);
          Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
          Property::operator=(out_prop,(Property *)local_610);
          Property::~Property((Property *)local_610);
          AttrMetas::~AttrMetas(&AStack_818);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_850);
          if (local_860 != (vtable_type *)0x0) {
            (*local_860->destroy)((storage_union *)&local_870);
            local_860 = (vtable_type *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_p != &local_880) {
            operator_delete(local_890._M_p,
                            CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]
                                    ) + 1);
          }
          pPVar7 = (Property *)(local_8b8 + 0x10);
          if ((Property *)local_8b8._0_8_ != pPVar7) {
            operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
            pPVar7 = extraout_RAX_01;
          }
        }
        else {
          iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
          if (iVar5 == 0) {
            (anonymous_namespace)::
            ToProperty<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                      (&anim->scales,out_prop,err_01);
            pPVar7 = (Property *)((ulong)extraout_var_02 << 8);
          }
          else {
            iVar5 = ::std::__cxx11::string::compare((char *)prop_name);
            if (iVar5 == 0) {
              (anonymous_namespace)::
              ToProperty<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                        (&anim->translations,out_prop,err_02);
              pPVar7 = (Property *)((ulong)extraout_var_03 << 8);
            }
            else {
              cVar6 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              *)&anim->props,prop_name);
              if ((_Rb_tree_header *)cVar6._M_node ==
                  &(anim->props)._M_t._M_impl.super__Rb_tree_header) {
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value = true;
                (__return_storage_ptr__->contained).
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .field_0.m_value = false;
                goto LAB_0033b81c;
              }
              pPVar7 = Property::operator=(out_prop,(Property *)(cVar6._M_node + 2));
            }
          }
        }
      }
    }
  }
  cVar6._M_node = (_Base_ptr)CONCAT71((int7)((ulong)pPVar7 >> 8),1);
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
LAB_0033b81c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,
                    CONCAT71(local_950.field_2._M_allocated_capacity._1_7_,
                             local_950.field_2._M_local_buf[0]) + 1);
    cVar6._M_node = (_Base_ptr)extraout_RAX_02;
  }
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)cVar6._M_node;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const SkelAnimation &anim, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("blendShapes", anim.blendShapes)
  TO_PROPERTY("blendShapeWeights", anim.blendShapeWeights)
  TO_PROPERTY("joints", anim.joints)
  TO_PROPERTY("rotations", anim.rotations)
  TO_PROPERTY("scales", anim.scales)
  TO_PROPERTY("translations", anim.translations)

  {
    const auto it = anim.props.find(prop_name);
    if (it == anim.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }
  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}